

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_vfs * sqlite3_vfs_find(char *zVfs)

{
  int iVar1;
  char *in_RDI;
  int rc;
  sqlite3_mutex *mutex;
  sqlite3_vfs *pVfs;
  sqlite3_vfs *local_18;
  sqlite3_vfs *local_8;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    sqlite3MutexAlloc(0);
    sqlite3_mutex_enter((sqlite3_mutex *)0x1327b9);
    local_18 = vfsList;
    while (((local_18 != (sqlite3_vfs *)0x0 && (in_RDI != (char *)0x0)) &&
           (iVar1 = strcmp(in_RDI,local_18->zName), iVar1 != 0))) {
      local_18 = local_18->pNext;
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x13280d);
    local_8 = local_18;
  }
  else {
    local_8 = (sqlite3_vfs *)0x0;
  }
  return local_8;
}

Assistant:

SQLITE_API sqlite3_vfs *sqlite3_vfs_find(const char *zVfs){
  sqlite3_vfs *pVfs = 0;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return 0;
#endif
#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
  sqlite3_mutex_enter(mutex);
  for(pVfs = vfsList; pVfs; pVfs=pVfs->pNext){
    if( zVfs==0 ) break;
    if( strcmp(zVfs, pVfs->zName)==0 ) break;
  }
  sqlite3_mutex_leave(mutex);
  return pVfs;
}